

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint128.cpp
# Opt level: O2

maybe<unsigned_long,_void> *
anon_unknown.dwarf_2c6756::get64
          (maybe<unsigned_long,_void> *__return_storage_ptr__,string *str,uint index)

{
  char cVar1;
  int iVar2;
  type tVar3;
  maybe<unsigned_int,_void> in_RAX;
  uint *puVar4;
  type tVar5;
  int iVar6;
  maybe<unsigned_int,_void> local_38;
  
  if (str->_M_string_length <= (ulong)index) {
    pstore::assert_failed
              ("index < str.length ()",
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/support/uint128.cpp"
               ,0x26);
  }
  iVar6 = 0x3c;
  tVar5 = (type)0x0;
  local_38 = in_RAX;
  do {
    if (iVar6 < 0) {
      __return_storage_ptr__->valid_ = true;
      __return_storage_ptr__->storage_ = tVar5;
      return __return_storage_ptr__;
    }
    cVar1 = (str->_M_dataplus)._M_p[index];
    iVar2 = (int)cVar1;
    if ((byte)(cVar1 + 0x9fU) < 6) {
      tVar3 = (type)(iVar2 + -0x57);
    }
    else if ((byte)(cVar1 + 0xbfU) < 6) {
      tVar3 = (type)(iVar2 + -0x37);
    }
    else {
      if (9 < (byte)(cVar1 - 0x30U)) {
        *(undefined8 *)__return_storage_ptr__ = 0;
        __return_storage_ptr__->storage_ = (type)0x0;
        return __return_storage_ptr__;
      }
      tVar3 = (type)(iVar2 + -0x30);
    }
    local_38.valid_ = true;
    local_38.storage_ = tVar3;
    puVar4 = pstore::maybe<unsigned_int,void>::
             value_impl<pstore::maybe<unsigned_int,void>const&,unsigned_int_const>(&local_38);
    tVar5.__data = tVar5.__data | (ulong)*puVar4 << ((byte)iVar6 & 0x3f);
    iVar6 = iVar6 + -4;
    index = index + 1;
  } while( true );
}

Assistant:

maybe<std::uint64_t> get64 (std::string const & str, unsigned index) {
        PSTORE_ASSERT (index < str.length ());
        auto result = std::uint64_t{0};
        for (auto shift = 60; shift >= 0; shift -= 4, ++index) {
            auto const digit = hex_to_digit (str[index]);
            if (!digit) {
                return nothing<std::uint64_t> ();
            }
            result |=
                (static_cast<std::uint64_t> (digit.value ()) << static_cast<unsigned> (shift));
        }
        return just (result);
    }